

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myexpand.c
# Opt level: O3

void read_file(FILE *file,int tabstop)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = 0;
  while( true ) {
    while( true ) {
      iVar1 = fgetc((FILE *)file);
      iVar1 = iVar1 << 0x18;
      if (iVar1 != 0x9000000) break;
      iVar1 = (iVar2 / tabstop + 1) * tabstop;
      iVar3 = iVar1 - iVar2;
      if (iVar3 != 0 && iVar2 <= iVar1) {
        do {
          fputc(0x20,_stdout);
          iVar3 = iVar3 + -1;
          iVar2 = iVar1;
        } while (iVar3 != 0);
      }
    }
    if (iVar1 == -0x1000000) break;
    fputc(iVar1 >> 0x18,_stdout);
    iVar2 = iVar2 + 1;
    if (iVar1 == 0xa000000) {
      iVar2 = 0;
    }
  }
  iVar2 = feof((FILE *)file);
  if (iVar2 == 0) {
    read_file_cold_1();
    halt_baddata();
  }
  return;
}

Assistant:

static void read_file(FILE *file, int tabstop)
{
	char readChar;
	int writePos = 0;
	while ((readChar = fgetc(file)) != EOF)
	{
		if (readChar == '\t')
		{
			int p = tabstop * ((writePos / tabstop) + 1);
			for (; writePos < p; writePos++)
			{
				fprintf(stdout, "%c", ' ');
			}
			continue;
		}

		writePos++;
		fprintf(stdout, "%c", readChar);
		if (readChar == '\n')
		{
			writePos = 0;
		}
	}
	if (!feof(file))
	{
		ERROR_EXIT("couldn't read file to end");
	}
}